

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O2

void buildJobs(Options *Opts,ParseResult *Result)

{
  pointer pbVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  OptionValue *pOVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  char *In;
  size_type sVar8;
  ostream *poVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *S;
  pointer pbVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string TgtLang;
  Parser parser;
  string OutTgtSrc;
  string local_450;
  ofstream OutTgtFileStream;
  ifstream InPhFileStream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string local_210 [488];
  
  std::__cxx11::string::string((string *)&InPhFileStream,"help",(allocator *)&OutTgtFileStream);
  sVar4 = cxxopts::ParseResult::count(Result,(string *)&InPhFileStream);
  std::__cxx11::string::~string((string *)&InPhFileStream);
  if (sVar4 != 0) {
    std::__cxx11::string::string((string *)&InPhFileStream,"",(allocator *)&OutTgtSrc);
    std::__cxx11::string::string(local_210,"Group",(allocator *)&parser);
    __l._M_len = 2;
    __l._M_array = (iterator)&InPhFileStream;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&TgtLang,__l,(allocator_type *)&local_450);
    cxxopts::Options::help
              ((string *)&OutTgtFileStream,Opts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&TgtLang);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&OutTgtFileStream);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&OutTgtFileStream);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&TgtLang);
    lVar7 = 0x20;
    do {
      std::__cxx11::string::~string((string *)(&InPhFileStream + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    exit(0);
  }
  std::ifstream::ifstream(&InPhFileStream);
  std::__cxx11::string::string((string *)&OutTgtFileStream,"input",(allocator *)&TgtLang);
  sVar4 = cxxopts::ParseResult::count(Result,(string *)&OutTgtFileStream);
  std::__cxx11::string::~string((string *)&OutTgtFileStream);
  if (sVar4 == 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"ph-opt");
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = std::operator<<(poVar9,"\x1b[31m error: \x1b[0m");
    std::operator<<(poVar9,"No input files! Usage see option \'--help\'.\n");
  }
  else {
    std::__cxx11::string::string((string *)&TgtLang,"input",(allocator *)&OutTgtSrc);
    pOVar5 = cxxopts::ParseResult::operator[](Result,&TgtLang);
    pbVar6 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
    std::__cxx11::string::string((string *)&OutTgtFileStream,(string *)pbVar6);
    std::__cxx11::string::~string((string *)&TgtLang);
    std::ifstream::open((string *)&InPhFileStream,(_Ios_Openmode)&OutTgtFileStream);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar9 = std::operator<<((ostream *)&std::cerr,"ph-opt");
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = std::operator<<(poVar9,"\x1b[31m error: \x1b[0m");
      poVar9 = std::operator<<(poVar9,"Fail to open ");
      poVar9 = std::operator<<(poVar9,(string *)&OutTgtFileStream);
      std::operator<<(poVar9,'\n');
    }
    else {
      lVar7 = (**(code **)(local_220._M_allocated_capacity + 0x20))(&local_220,0,2,8);
      (**(code **)(local_220._M_allocated_capacity + 0x28))(&local_220,0,0,8);
      In = (char *)operator_new__(lVar7 + 1);
      (**(code **)(local_220._M_allocated_capacity + 0x40))(&local_220,In,lVar7);
      In[lVar7] = '\0';
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&OutTgtFileStream);
      std::__cxx11::string::string((string *)&TgtLang,"",(allocator *)&OutTgtFileStream);
      std::__cxx11::string::string((string *)&OutTgtFileStream,"lang",(allocator *)&OutTgtSrc);
      sVar4 = cxxopts::ParseResult::count(Result,(string *)&OutTgtFileStream);
      std::__cxx11::string::~string((string *)&OutTgtFileStream);
      if (sVar4 == 0) {
        std::__cxx11::string::assign((char *)&TgtLang);
      }
      else {
        std::__cxx11::string::string((string *)&OutTgtFileStream,"lang",(allocator *)&OutTgtSrc);
        pOVar5 = cxxopts::ParseResult::operator[](Result,(string *)&OutTgtFileStream);
        cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
        std::__cxx11::string::_M_assign((string *)&TgtLang);
        std::__cxx11::string::~string((string *)&OutTgtFileStream);
        phaeton::toUpperCase(&TgtLang);
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&VALID_TARGET_LANG_abi_cxx11_,&TgtLang);
        if (sVar8 == 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"ph-opt");
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = std::operator<<(poVar9,"\x1b[31m error: \x1b[0m");
          std::operator<<(poVar9,
                          "Unknown target language! Now only support \'Numpy, OpenMP, OpenCL, Cuda, Bang, CCE, TPU\'.\n"
                         );
          goto LAB_0010db9e;
        }
      }
      phaeton::toUpperCase(&TgtLang);
      std::__cxx11::string::string((string *)&OutTgtSrc,"",(allocator *)&OutTgtFileStream);
      std::__cxx11::string::string((string *)&OutTgtFileStream,"output",(allocator *)&parser);
      sVar4 = cxxopts::ParseResult::count(Result,(string *)&OutTgtFileStream);
      std::__cxx11::string::~string((string *)&OutTgtFileStream);
      if (sVar4 == 0) {
        getDefaultOutputFileName((string *)&OutTgtFileStream,&TgtLang);
        std::__cxx11::string::operator=((string *)&OutTgtSrc,(string *)&OutTgtFileStream);
      }
      else {
        std::__cxx11::string::string((string *)&OutTgtFileStream,"output",(allocator *)&parser);
        pOVar5 = cxxopts::ParseResult::operator[](Result,(string *)&OutTgtFileStream);
        cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
        std::__cxx11::string::_M_assign((string *)&OutTgtSrc);
      }
      std::__cxx11::string::~string((string *)&OutTgtFileStream);
      std::__cxx11::string::string((string *)&OutTgtFileStream,"positional",(allocator *)&parser);
      sVar4 = cxxopts::ParseResult::count(Result,(string *)&OutTgtFileStream);
      std::__cxx11::string::~string((string *)&OutTgtFileStream);
      if (sVar4 != 0) {
        std::operator<<((ostream *)&std::cout,"Positional = {");
        std::__cxx11::string::string((string *)&OutTgtFileStream,"positional",(allocator *)&parser);
        pOVar5 = cxxopts::ParseResult::operator[](Result,(string *)&OutTgtFileStream);
        pvVar10 = cxxopts::OptionValue::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar5)
        ;
        std::__cxx11::string::~string((string *)&OutTgtFileStream);
        pbVar1 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = (pvVar10->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
            pbVar11 = pbVar11 + 1) {
          poVar9 = std::operator<<((ostream *)&std::cout,(string *)pbVar11);
          std::operator<<(poVar9,", ");
        }
        poVar9 = std::operator<<((ostream *)&std::cout,"}");
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      phaeton::Lexer::Lexer(&parser.PhaetonLexer,In);
      iVar3 = phaeton::Parser::parse(&parser);
      if (iVar3 == 0) {
        operator_delete__(In);
        std::ofstream::ofstream(&OutTgtFileStream,(string *)&OutTgtSrc,_S_out);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          getTargetLanguageCode(&local_450,&parser,&TgtLang);
          std::operator<<((ostream *)&OutTgtFileStream,(string *)&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          std::ofstream::close();
          phaeton::Program::destroy(parser.AST);
          std::ofstream::~ofstream(&OutTgtFileStream);
          phaeton::Lexer::~Lexer(&parser.PhaetonLexer);
          std::__cxx11::string::~string((string *)&OutTgtSrc);
          std::__cxx11::string::~string((string *)&TgtLang);
          std::ifstream::~ifstream(&InPhFileStream);
          return;
        }
        poVar9 = std::operator<<((ostream *)&std::cerr,"ph-opt");
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = std::operator<<(poVar9,"\x1b[31m error: \x1b[0m");
        poVar9 = std::operator<<(poVar9,"Fail to open file ");
        poVar9 = std::operator<<(poVar9,(string *)&OutTgtSrc);
        std::operator<<(poVar9,'\n');
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,"ph-opt");
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = std::operator<<(poVar9,"\x1b[31m error: \x1b[0m");
        std::operator<<(poVar9,"Fail to parse input Phaeton tokens\n");
      }
    }
  }
LAB_0010db9e:
  exit(-1);
}

Assistant:

void buildJobs(const Options &Opts, const ParseResult &Result) {
  // Dump the help text message
  if (Result.count("help")) {
    std::cout << Opts.help({"", "Group"}) << std::endl;
    exit(EXIT_SUCCESS);
  }

  std::ifstream InPhFileStream;
  char *InPhTokens = NULL;

  // If we get here, that means, we don't pass the 'help' option,
  // so the user must have at least one input.
  if (Result.count("input")) {
    std::string PhSrcFile = Result["input"].as<std::string>();
    InPhFileStream.open(PhSrcFile);
    // Fail to open input source file.
    if (!InPhFileStream.is_open()) {
      std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
                << "Fail to open " << PhSrcFile << '\n';
      exit(-1);
    }
    std::filebuf *FileBuf = InPhFileStream.rdbuf();
    std::size_t Size =
        FileBuf->pubseekoff(0, InPhFileStream.end, InPhFileStream.in);
    FileBuf->pubseekpos(0, InPhFileStream.in);

    InPhTokens = new char[Size + 1];
    FileBuf->sgetn(InPhTokens, Size);
    InPhTokens[Size] = 0;
    InPhFileStream.close();
  } else {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "No input files! Usage see option '--help'.\n";
    exit(-1);
  }

  // Then we need to determine the final phase.

  std::string TgtLang = "";
  // If we get here, that means we need to translate Phaeton into target
  // language.
  if (Result.count("lang")) {
    TgtLang = Result["lang"].as<std::string>();
    // Uniform use of upper case
    toUpperCase(TgtLang);
    if (!VALID_TARGET_LANG.count(TgtLang)) {
      std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
                << "Unknown target language! Now only support 'Numpy, OpenMP, "
                   "OpenCL, Cuda, Bang, CCE, TPU'.\n";
      exit(-1);
    }
  } else {
    // Default target language is OpenMP
    TgtLang = "OpenMP";
  }
  // Uniform use of upper case
  toUpperCase(TgtLang);

  std::string OutTgtSrc = "";
  // If we get here, that means we have already get the target language.
  if (Result.count("output")) {
    OutTgtSrc = Result["output"].as<std::string>();
  } else {
    // Default output name.
    OutTgtSrc = getDefaultOutputFileName(TgtLang);
  }

  if (Result.count("positional")) {
    std::cout << "Positional = {";
    auto &V = Result["positional"].as<std::vector<std::string>>();
    for (const auto &S : V) {
      std::cout << S << ", ";
    }
    std::cout << "}" << std::endl;
  }

  // If we get here, that means we have to perform translation to
  // translate Phaeton input source file into the target language
  // output.
  Parser parser(InPhTokens);
  if (parser.parse()) {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "Fail to parse input Phaeton tokens\n";
    exit(-1);
  }
  // parser.getAST()->dump();
  delete[] InPhTokens;

  std::ofstream OutTgtFileStream(OutTgtSrc);
  if (OutTgtFileStream.is_open()) {
    OutTgtFileStream << getTargetLanguageCode(parser, TgtLang);
    OutTgtFileStream.close();
  } else {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "Fail to open file " << OutTgtSrc << '\n';
    exit(-1);
  }
  Program::destroy(parser.getAST());
}